

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uri.c
# Opt level: O2

xmlChar * xmlBuildURI(xmlChar *URI,xmlChar *base)

{
  xmlChar xVar1;
  int iVar2;
  xmlURIPtr uri;
  xmlURIPtr uri_00;
  xmlURIPtr uri_01;
  xmlChar *pxVar3;
  char *pcVar4;
  size_t sVar5;
  long lVar6;
  long lVar7;
  xmlURIPtr pxVar8;
  long lVar9;
  char cVar10;
  long lStack_30;
  
  if (URI == (xmlChar *)0x0) {
    return (xmlChar *)0x0;
  }
  xVar1 = *URI;
  if (xVar1 == '\0') {
    uri = (xmlURIPtr)0x0;
LAB_0018782d:
    if (base == (xmlChar *)0x0) {
      uri_00 = (xmlURIPtr)0x0;
LAB_0018787c:
      if (xVar1 == '\0') {
        uri_01 = (xmlURIPtr)0x0;
        pxVar3 = (xmlChar *)0x0;
      }
      else {
        pxVar3 = xmlSaveUri(uri);
LAB_001878ab:
        uri_01 = (xmlURIPtr)0x0;
        if (uri != (xmlURIPtr)0x0) goto LAB_001878b3;
      }
      goto LAB_001878bb;
    }
    uri_00 = xmlCreateURI();
    if (uri_00 == (xmlURIPtr)0x0) {
      pxVar3 = (xmlChar *)0x0;
      uri_00 = (xmlURIPtr)0x0;
      goto LAB_001878ab;
    }
    iVar2 = xmlParse3986URIReference(uri_00,(char *)base);
    if (iVar2 != 0) goto LAB_0018787c;
    if (xVar1 != '\0') {
      uri_01 = xmlCreateURI();
      if (uri_01 == (xmlURIPtr)0x0) {
        pxVar3 = (xmlChar *)0x0;
        goto LAB_001878ab;
      }
      pxVar8 = uri;
      if (uri->scheme == (char *)0x0) {
        pxVar8 = uri_01;
        if (((uri->path == (char *)0x0) && (uri->authority == (char *)0x0)) &&
           (uri->server == (char *)0x0)) {
          if (uri_00->scheme != (char *)0x0) {
            pcVar4 = (*xmlMemStrdup)(uri_00->scheme);
            uri_01->scheme = pcVar4;
          }
          if (uri_00->authority == (char *)0x0) {
            if (uri_00->server == (char *)0x0) {
              if (uri_00->port != -1) goto LAB_00187bc8;
            }
            else {
              pcVar4 = (*xmlMemStrdup)(uri_00->server);
              uri_01->server = pcVar4;
            }
            if (uri_00->user != (char *)0x0) {
              pcVar4 = (*xmlMemStrdup)(uri_00->user);
              uri_01->user = pcVar4;
            }
            uri_01->port = uri_00->port;
          }
          else {
            pcVar4 = (*xmlMemStrdup)(uri_00->authority);
            uri_01->authority = pcVar4;
          }
LAB_00187bc8:
          if (uri_00->path != (char *)0x0) {
            pcVar4 = (*xmlMemStrdup)(uri_00->path);
            uri_01->path = pcVar4;
          }
          pcVar4 = uri->query_raw;
          lVar6 = 0x50;
          if (pcVar4 == (char *)0x0) {
            pcVar4 = uri->query;
            lVar6 = 0x38;
            if (((pcVar4 != (char *)0x0) ||
                (pcVar4 = uri_00->query_raw, lVar6 = 0x50, pcVar4 != (char *)0x0)) ||
               (pcVar4 = uri_00->query, lVar6 = 0x38, pcVar4 != (char *)0x0)) goto LAB_00187c11;
          }
          else {
LAB_00187c11:
            pcVar4 = (*xmlMemStrdup)(pcVar4);
            *(char **)((long)&uri_01->scheme + lVar6) = pcVar4;
          }
          if (uri->fragment != (char *)0x0) {
            pcVar4 = (*xmlMemStrdup)(uri->fragment);
            uri_01->fragment = pcVar4;
          }
        }
        else {
          if (uri_00->scheme != (char *)0x0) {
            pcVar4 = (*xmlMemStrdup)(uri_00->scheme);
            uri_01->scheme = pcVar4;
          }
          pcVar4 = uri->query_raw;
          if (pcVar4 == (char *)0x0) {
            pcVar4 = uri->query;
            if (pcVar4 != (char *)0x0) {
              lStack_30 = 0x38;
              goto LAB_0018795a;
            }
          }
          else {
            lStack_30 = 0x50;
LAB_0018795a:
            pcVar4 = (*xmlMemStrdup)(pcVar4);
            *(char **)((long)&uri_01->scheme + lStack_30) = pcVar4;
          }
          if (uri->fragment != (char *)0x0) {
            pcVar4 = (*xmlMemStrdup)(uri->fragment);
            uri_01->fragment = pcVar4;
          }
          if (uri->authority == (char *)0x0) {
            if (uri->server != (char *)0x0) {
              pcVar4 = (*xmlMemStrdup)(uri->server);
              uri_01->server = pcVar4;
              if (uri->user != (char *)0x0) {
                pcVar4 = (*xmlMemStrdup)(uri->user);
                uri_01->user = pcVar4;
              }
              uri_01->port = uri->port;
              goto LAB_001879c8;
            }
            if (uri_00->authority == (char *)0x0) {
              if (uri_00->server == (char *)0x0) {
                if (uri_00->port != -1) goto LAB_00187aaf;
              }
              else {
                pcVar4 = (*xmlMemStrdup)(uri_00->server);
                uri_01->server = pcVar4;
              }
              if (uri_00->user != (char *)0x0) {
                pcVar4 = (*xmlMemStrdup)(uri_00->user);
                uri_01->user = pcVar4;
              }
              uri_01->port = uri_00->port;
            }
            else {
              pcVar4 = (*xmlMemStrdup)(uri_00->authority);
              uri_01->authority = pcVar4;
            }
LAB_00187aaf:
            pcVar4 = uri->path;
            if (pcVar4 == (char *)0x0) {
              iVar2 = 2;
LAB_00187ad3:
              if (uri_00->path != (char *)0x0) {
                sVar5 = strlen(uri_00->path);
                iVar2 = iVar2 + (int)sVar5;
              }
              pcVar4 = (char *)(*xmlMallocAtomic)((long)iVar2);
              uri_01->path = pcVar4;
              if (pcVar4 == (char *)0x0) {
                xmlURIErrMemory("resolving URI against base\n");
                goto LAB_0018781a;
              }
              *pcVar4 = '\0';
              pcVar4 = uri_00->path;
              if (pcVar4 == (char *)0x0) {
                iVar2 = 0;
              }
              else {
                lVar7 = 0;
                lVar6 = 0;
                while( true ) {
                  iVar2 = (int)lVar6;
                  lVar7 = (long)(int)lVar7;
                  cVar10 = pcVar4[lVar7];
                  if (cVar10 == '\0') break;
                  lVar9 = lVar7 << 0x20;
                  while( true ) {
                    lVar7 = lVar7 + 1;
                    if (cVar10 == '\0') goto LAB_00187b7a;
                    if (cVar10 == '/') break;
                    cVar10 = pcVar4[lVar7];
                    lVar9 = lVar9 + 0x100000000;
                  }
                  for (lVar6 = (long)iVar2; lVar6 <= lVar9 >> 0x20; lVar6 = lVar6 + 1) {
                    uri_01->path[lVar6] = uri_00->path[lVar6];
                  }
                  pcVar4 = uri_00->path;
                }
              }
LAB_00187b7a:
              lVar6 = (long)iVar2;
              uri_01->path[lVar6] = '\0';
              if ((uri->path != (char *)0x0) && (*uri->path != '\0')) {
                if (iVar2 == 0) {
                  if (uri_00->server == (char *)0x0) {
                    iVar2 = 0;
                  }
                  else {
                    uri_01->path[lVar6] = '/';
                    iVar2 = 1;
                  }
                }
                lVar6 = (long)iVar2 << 0x20;
                for (lVar7 = 0; uri->path[lVar7] != '\0'; lVar7 = lVar7 + 1) {
                  uri_01->path[lVar7 + iVar2] = uri->path[lVar7];
                  lVar6 = lVar6 + 0x100000000;
                }
                lVar6 = lVar6 >> 0x20;
              }
              uri_01->path[lVar6] = '\0';
              xmlNormalizeURIPath(uri_01->path);
              goto LAB_001879e1;
            }
            if (*pcVar4 != '/') {
              sVar5 = strlen(pcVar4);
              iVar2 = (int)sVar5 + 2;
              goto LAB_00187ad3;
            }
          }
          else {
            pcVar4 = (*xmlMemStrdup)(uri->authority);
            uri_01->authority = pcVar4;
LAB_001879c8:
            pcVar4 = uri->path;
            if (pcVar4 == (char *)0x0) goto LAB_001879e1;
          }
          pcVar4 = (*xmlMemStrdup)(pcVar4);
          uri_01->path = pcVar4;
        }
      }
LAB_001879e1:
      pxVar3 = xmlSaveUri(pxVar8);
      goto LAB_001878b3;
    }
    if (uri_00->fragment != (char *)0x0) {
      (*xmlFree)(uri_00->fragment);
      uri_00->fragment = (char *)0x0;
    }
    pxVar3 = xmlSaveUri(uri_00);
    uri_01 = (xmlURIPtr)0x0;
  }
  else {
    uri = xmlCreateURI();
    if (uri == (xmlURIPtr)0x0) {
      return (xmlChar *)0x0;
    }
    iVar2 = xmlParse3986URIReference(uri,(char *)URI);
    if (iVar2 == 0) {
      if (uri->scheme == (char *)0x0) goto LAB_0018782d;
      pxVar3 = xmlStrdup(URI);
      uri_01 = (xmlURIPtr)0x0;
      uri_00 = (xmlURIPtr)0x0;
    }
    else {
      uri_01 = (xmlURIPtr)0x0;
      uri_00 = (xmlURIPtr)0x0;
LAB_0018781a:
      pxVar3 = (xmlChar *)0x0;
    }
LAB_001878b3:
    xmlFreeURI(uri);
LAB_001878bb:
    if (uri_00 == (xmlURIPtr)0x0) goto LAB_001878c8;
  }
  xmlFreeURI(uri_00);
LAB_001878c8:
  if (uri_01 != (xmlURIPtr)0x0) {
    xmlFreeURI(uri_01);
  }
  return pxVar3;
}

Assistant:

xmlChar *
xmlBuildURI(const xmlChar *URI, const xmlChar *base) {
    xmlChar *val = NULL;
    int ret, len, indx, cur, out;
    xmlURIPtr ref = NULL;
    xmlURIPtr bas = NULL;
    xmlURIPtr res = NULL;

    /*
     * 1) The URI reference is parsed into the potential four components and
     *    fragment identifier, as described in Section 4.3.
     *
     *    NOTE that a completely empty URI is treated by modern browsers
     *    as a reference to "." rather than as a synonym for the current
     *    URI.  Should we do that here?
     */
    if (URI == NULL)
	ret = -1;
    else {
	if (*URI) {
	    ref = xmlCreateURI();
	    if (ref == NULL)
		goto done;
	    ret = xmlParseURIReference(ref, (const char *) URI);
	}
	else
	    ret = 0;
    }
    if (ret != 0)
	goto done;
    if ((ref != NULL) && (ref->scheme != NULL)) {
	/*
	 * The URI is absolute don't modify.
	 */
	val = xmlStrdup(URI);
	goto done;
    }
    if (base == NULL)
	ret = -1;
    else {
	bas = xmlCreateURI();
	if (bas == NULL)
	    goto done;
	ret = xmlParseURIReference(bas, (const char *) base);
    }
    if (ret != 0) {
	if (ref)
	    val = xmlSaveUri(ref);
	goto done;
    }
    if (ref == NULL) {
	/*
	 * the base fragment must be ignored
	 */
	if (bas->fragment != NULL) {
	    xmlFree(bas->fragment);
	    bas->fragment = NULL;
	}
	val = xmlSaveUri(bas);
	goto done;
    }

    /*
     * 2) If the path component is empty and the scheme, authority, and
     *    query components are undefined, then it is a reference to the
     *    current document and we are done.  Otherwise, the reference URI's
     *    query and fragment components are defined as found (or not found)
     *    within the URI reference and not inherited from the base URI.
     *
     *    NOTE that in modern browsers, the parsing differs from the above
     *    in the following aspect:  the query component is allowed to be
     *    defined while still treating this as a reference to the current
     *    document.
     */
    res = xmlCreateURI();
    if (res == NULL)
	goto done;
    if ((ref->scheme == NULL) && (ref->path == NULL) &&
	((ref->authority == NULL) && (ref->server == NULL))) {
	if (bas->scheme != NULL)
	    res->scheme = xmlMemStrdup(bas->scheme);
	if (bas->authority != NULL)
	    res->authority = xmlMemStrdup(bas->authority);
	else if ((bas->server != NULL) || (bas->port == -1)) {
	    if (bas->server != NULL)
		res->server = xmlMemStrdup(bas->server);
	    if (bas->user != NULL)
		res->user = xmlMemStrdup(bas->user);
	    res->port = bas->port;
	}
	if (bas->path != NULL)
	    res->path = xmlMemStrdup(bas->path);
	if (ref->query_raw != NULL)
	    res->query_raw = xmlMemStrdup (ref->query_raw);
	else if (ref->query != NULL)
	    res->query = xmlMemStrdup(ref->query);
	else if (bas->query_raw != NULL)
	    res->query_raw = xmlMemStrdup(bas->query_raw);
	else if (bas->query != NULL)
	    res->query = xmlMemStrdup(bas->query);
	if (ref->fragment != NULL)
	    res->fragment = xmlMemStrdup(ref->fragment);
	goto step_7;
    }

    /*
     * 3) If the scheme component is defined, indicating that the reference
     *    starts with a scheme name, then the reference is interpreted as an
     *    absolute URI and we are done.  Otherwise, the reference URI's
     *    scheme is inherited from the base URI's scheme component.
     */
    if (ref->scheme != NULL) {
	val = xmlSaveUri(ref);
	goto done;
    }
    if (bas->scheme != NULL)
	res->scheme = xmlMemStrdup(bas->scheme);

    if (ref->query_raw != NULL)
	res->query_raw = xmlMemStrdup(ref->query_raw);
    else if (ref->query != NULL)
	res->query = xmlMemStrdup(ref->query);
    if (ref->fragment != NULL)
	res->fragment = xmlMemStrdup(ref->fragment);

    /*
     * 4) If the authority component is defined, then the reference is a
     *    network-path and we skip to step 7.  Otherwise, the reference
     *    URI's authority is inherited from the base URI's authority
     *    component, which will also be undefined if the URI scheme does not
     *    use an authority component.
     */
    if ((ref->authority != NULL) || (ref->server != NULL)) {
	if (ref->authority != NULL)
	    res->authority = xmlMemStrdup(ref->authority);
	else {
	    res->server = xmlMemStrdup(ref->server);
	    if (ref->user != NULL)
		res->user = xmlMemStrdup(ref->user);
            res->port = ref->port;
	}
	if (ref->path != NULL)
	    res->path = xmlMemStrdup(ref->path);
	goto step_7;
    }
    if (bas->authority != NULL)
	res->authority = xmlMemStrdup(bas->authority);
    else if ((bas->server != NULL) || (bas->port == -1)) {
	if (bas->server != NULL)
	    res->server = xmlMemStrdup(bas->server);
	if (bas->user != NULL)
	    res->user = xmlMemStrdup(bas->user);
	res->port = bas->port;
    }

    /*
     * 5) If the path component begins with a slash character ("/"), then
     *    the reference is an absolute-path and we skip to step 7.
     */
    if ((ref->path != NULL) && (ref->path[0] == '/')) {
	res->path = xmlMemStrdup(ref->path);
	goto step_7;
    }


    /*
     * 6) If this step is reached, then we are resolving a relative-path
     *    reference.  The relative path needs to be merged with the base
     *    URI's path.  Although there are many ways to do this, we will
     *    describe a simple method using a separate string buffer.
     *
     * Allocate a buffer large enough for the result string.
     */
    len = 2; /* extra / and 0 */
    if (ref->path != NULL)
	len += strlen(ref->path);
    if (bas->path != NULL)
	len += strlen(bas->path);
    res->path = (char *) xmlMallocAtomic(len);
    if (res->path == NULL) {
        xmlURIErrMemory("resolving URI against base\n");
	goto done;
    }
    res->path[0] = 0;

    /*
     * a) All but the last segment of the base URI's path component is
     *    copied to the buffer.  In other words, any characters after the
     *    last (right-most) slash character, if any, are excluded.
     */
    cur = 0;
    out = 0;
    if (bas->path != NULL) {
	while (bas->path[cur] != 0) {
	    while ((bas->path[cur] != 0) && (bas->path[cur] != '/'))
		cur++;
	    if (bas->path[cur] == 0)
		break;

	    cur++;
	    while (out < cur) {
		res->path[out] = bas->path[out];
		out++;
	    }
	}
    }
    res->path[out] = 0;

    /*
     * b) The reference's path component is appended to the buffer
     *    string.
     */
    if (ref->path != NULL && ref->path[0] != 0) {
	indx = 0;
	/*
	 * Ensure the path includes a '/'
	 */
	if ((out == 0) && (bas->server != NULL))
	    res->path[out++] = '/';
	while (ref->path[indx] != 0) {
	    res->path[out++] = ref->path[indx++];
	}
    }
    res->path[out] = 0;

    /*
     * Steps c) to h) are really path normalization steps
     */
    xmlNormalizeURIPath(res->path);

step_7:

    /*
     * 7) The resulting URI components, including any inherited from the
     *    base URI, are recombined to give the absolute form of the URI
     *    reference.
     */
    val = xmlSaveUri(res);

done:
    if (ref != NULL)
	xmlFreeURI(ref);
    if (bas != NULL)
	xmlFreeURI(bas);
    if (res != NULL)
	xmlFreeURI(res);
    return(val);
}